

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O0

uint32_t cpu_ppc_load_tbu_ppc(CPUPPCState_conflict *env)

{
  uint32_t uVar1;
  CPUPPCState_conflict *env_local;
  
  uVar1 = _cpu_ppc_load_tbu(env);
  return uVar1;
}

Assistant:

uint32_t cpu_ppc_load_tbu (CPUPPCState *env)
{
#if 0
    if (kvm_enabled()) {
        return env->spr[SPR_TBU];
    }
#endif

    return _cpu_ppc_load_tbu(env);
}